

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedDeepImageChannel<float>::initializeSampleLists(TypedDeepImageChannel<float> *this)

{
  uint uVar1;
  ImageLevel *pIVar2;
  long lVar3;
  _func_int **pp_Var4;
  Vec2<int> VVar5;
  ulong uVar6;
  float **ppfVar7;
  float *pfVar8;
  uint j;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  
  if (this->_sampleBuffer != (float *)0x0) {
    operator_delete__(this->_sampleBuffer);
  }
  this->_sampleBuffer = (float *)0x0;
  pIVar2 = (this->super_DeepImageChannel).super_ImageChannel._level;
  lVar3 = *(long *)&pIVar2[3]._xLevelNumber;
  pp_Var4 = pIVar2[4]._vptr_ImageLevel;
  VVar5 = pIVar2[4]._dataWindow.min;
  pfVar8 = (float *)operator_new__(-(ulong)((ulong)VVar5 >> 0x3e != 0) | (long)VVar5 << 2);
  this->_sampleBuffer = pfVar8;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[9])(this);
  uVar6 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  for (uVar10 = 0; uVar10 < uVar6; uVar10 = uVar10 + 1) {
    this->_sampleListPointers[uVar10] = this->_sampleBuffer + (long)pp_Var4[uVar10];
    uVar1 = *(uint *)(lVar3 + uVar10 * 4);
    ppfVar7 = this->_sampleListPointers;
    for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 1) {
      ppfVar7[uVar10][uVar9] = 0.0;
    }
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete[] _sampleBuffer;

    _sampleBuffer = 0; // set to 0 to prevent double deletion
                       // in case of an exception

    const unsigned int* numSamples    = sampleCounts ().numSamples ();
    const size_t* sampleListPositions = sampleCounts ().sampleListPositions ();

    _sampleBuffer = new T[sampleCounts ().sampleBufferSize ()];

    resetBasePointer ();

    for (size_t i = 0; i < numPixels (); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}